

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void exp2reg(FuncState *fs,expdesc *e,int reg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  discharge2reg(fs,e,reg);
  if (e->k == VJMP) {
    luaK_concat(fs,&e->t,(e->u).s.info);
  }
  iVar2 = e->f;
  if (e->t == iVar2) goto LAB_001061b6;
  iVar1 = need_value(fs,e->t);
  if (iVar1 == 0) {
    iVar2 = need_value(fs,iVar2);
    if (iVar2 != 0) goto LAB_0010610d;
    iVar1 = -1;
    iVar2 = -1;
  }
  else {
LAB_0010610d:
    iVar3 = -1;
    if (e->k != VJMP) {
      iVar3 = luaK_jump(fs);
    }
    fs->lasttarget = fs->pc;
    iVar2 = luaK_code(fs,reg << 6 | 0x4002,fs->ls->lastline);
    fs->lasttarget = fs->pc;
    iVar1 = luaK_code(fs,reg << 6 | 0x800002,fs->ls->lastline);
    fs->lasttarget = fs->pc;
    luaK_concat(fs,&fs->jpc,iVar3);
  }
  iVar3 = fs->pc;
  fs->lasttarget = iVar3;
  patchlistaux(fs,e->f,iVar3,reg,iVar2);
  patchlistaux(fs,e->t,iVar3,reg,iVar1);
LAB_001061b6:
  e->t = -1;
  e->f = -1;
  (e->u).s.info = reg;
  e->k = VNONRELOC;
  return;
}

Assistant:

static void exp2reg (FuncState *fs, expdesc *e, int reg) {
  discharge2reg(fs, e, reg);
  if (e->k == VJMP)
    luaK_concat(fs, &e->t, e->u.s.info);  /* put this jump in `t' list */
  if (hasjumps(e)) {
    int final;  /* position after whole expression */
    int p_f = NO_JUMP;  /* position of an eventual LOAD false */
    int p_t = NO_JUMP;  /* position of an eventual LOAD true */
    if (need_value(fs, e->t) || need_value(fs, e->f)) {
      int fj = (e->k == VJMP) ? NO_JUMP : luaK_jump(fs);
      p_f = code_label(fs, reg, 0, 1);
      p_t = code_label(fs, reg, 1, 0);
      luaK_patchtohere(fs, fj);
    }
    final = luaK_getlabel(fs);
    patchlistaux(fs, e->f, final, reg, p_f);
    patchlistaux(fs, e->t, final, reg, p_t);
  }
  e->f = e->t = NO_JUMP;
  e->u.s.info = reg;
  e->k = VNONRELOC;
}